

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  long lVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  p_Var5 = (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var6 = &(this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
  bVar7 = (_Rb_tree_header *)p_Var5 == p_Var6;
  if (!bVar7) {
    lVar1 = *(long *)(p_Var5 + 1);
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    plVar2 = *(long **)(lVar1 + 0x40);
    cVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,*(undefined4 *)(lVar1 + 0x80));
    while ((cVar3 != '\0' &&
           (bVar4 = AllPrerequisitesAreSatisfied(*(ExpectationBase **)(p_Var5 + 1)), bVar4))) {
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      bVar7 = (_Rb_tree_header *)p_Var5 == p_Var6;
      if (bVar7) {
        return bVar7;
      }
      lVar1 = *(long *)(p_Var5 + 1);
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      plVar2 = *(long **)(lVar1 + 0x40);
      cVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,*(undefined4 *)(lVar1 + 0x80));
    }
  }
  return bVar7;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (!(it->expectation_base()->IsSatisfied()) ||
        !(it->expectation_base()->AllPrerequisitesAreSatisfied()))
      return false;
  }
  return true;
}